

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_boost_po_test.cc
# Opt level: O0

void was_supplied_test_invoker(void)

{
  undefined8 uVar1;
  basic_wrap_stringstream<char> *this;
  basic_wrap_stringstream<char> *s;
  basic_wrap_stringstream<char> *pbVar2;
  was_supplied_test t;
  char (*in_stack_fffffffffffff638) [19];
  basic_wrap_stringstream<char> *in_stack_fffffffffffff640;
  std_string *in_stack_fffffffffffff648;
  basic_cstring<const_char> *in_stack_fffffffffffff650;
  basic_wrap_stringstream<char> *in_stack_fffffffffffff660;
  basic_wrap_stringstream<char> local_8c8;
  undefined1 local_730 [16];
  basic_cstring<const_char> local_720;
  undefined1 local_709;
  basic_wrap_stringstream<char> local_708;
  undefined1 local_570 [16];
  basic_cstring<const_char> local_560;
  undefined1 local_549;
  basic_wrap_stringstream<char> local_548;
  undefined1 local_3b0 [16];
  basic_cstring<const_char> local_3a0;
  undefined1 local_389;
  basic_wrap_stringstream<char> local_388;
  undefined1 local_1f0 [16];
  basic_cstring<const_char> local_1e0 [2];
  undefined1 local_1b9;
  was_supplied_test *in_stack_fffffffffffffee0;
  undefined1 local_20 [16];
  basic_cstring<const_char> local_10;
  
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_10,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/test/unit_test/options_boost_po_test.cc"
             ,0x76);
  memset((basic_wrap_stringstream<char> *)&stack0xfffffffffffffe48,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff640);
  boost::basic_wrap_stringstream<char>::ref
            ((basic_wrap_stringstream<char> *)&stack0xfffffffffffffe48);
  local_1b9 = 0x22;
  boost::operator<<(in_stack_fffffffffffff640,*in_stack_fffffffffffff638);
  boost::operator<<(in_stack_fffffffffffff640,(char (*) [18])in_stack_fffffffffffff638);
  boost::operator<<(in_stack_fffffffffffff640,(char (*) [15])in_stack_fffffffffffff638);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff660);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            (in_stack_fffffffffffff650,in_stack_fffffffffffff648);
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_10,0xf8,local_20);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff640);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (local_1e0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/test/unit_test/options_boost_po_test.cc"
             ,0x76);
  memset(&local_388,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff640);
  boost::basic_wrap_stringstream<char>::ref(&local_388);
  local_389 = 0x22;
  boost::operator<<(in_stack_fffffffffffff640,*in_stack_fffffffffffff638);
  boost::operator<<(in_stack_fffffffffffff640,(char (*) [18])in_stack_fffffffffffff638);
  boost::operator<<(in_stack_fffffffffffff640,(char (*) [16])in_stack_fffffffffffff638);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff660);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            (in_stack_fffffffffffff650,in_stack_fffffffffffff648);
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,local_1e0,0xf8,local_1f0);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff640);
  boost::unit_test::setup_conditional<was_supplied_test>
            ((was_supplied_test *)in_stack_fffffffffffff640);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_3a0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/test/unit_test/options_boost_po_test.cc"
             ,0x76);
  memset(&local_548,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff640);
  boost::basic_wrap_stringstream<char>::ref(&local_548);
  local_549 = 0x22;
  boost::operator<<(in_stack_fffffffffffff640,*in_stack_fffffffffffff638);
  boost::operator<<(in_stack_fffffffffffff640,(char (*) [18])in_stack_fffffffffffff638);
  boost::operator<<(in_stack_fffffffffffff640,(char (*) [13])in_stack_fffffffffffff638);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff660);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            (in_stack_fffffffffffff650,in_stack_fffffffffffff648);
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_3a0,0xf8,local_3b0);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff640);
  was_supplied_test::test_method(in_stack_fffffffffffffee0);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_560,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/test/unit_test/options_boost_po_test.cc"
             ,0x76);
  memset(&local_708,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff640);
  boost::basic_wrap_stringstream<char>::ref(&local_708);
  local_709 = 0x22;
  boost::operator<<(in_stack_fffffffffffff640,*in_stack_fffffffffffff638);
  boost::operator<<(in_stack_fffffffffffff640,(char (*) [18])in_stack_fffffffffffff638);
  boost::operator<<(in_stack_fffffffffffff640,in_stack_fffffffffffff638);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff660);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            (in_stack_fffffffffffff650,in_stack_fffffffffffff648);
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_560,0xf8,local_570);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff640);
  boost::unit_test::teardown_conditional<was_supplied_test>
            ((was_supplied_test *)in_stack_fffffffffffff640);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_720,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/test/unit_test/options_boost_po_test.cc"
             ,0x76);
  pbVar2 = &local_8c8;
  memset(pbVar2,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff640);
  boost::basic_wrap_stringstream<char>::ref(pbVar2);
  boost::operator<<(in_stack_fffffffffffff640,*in_stack_fffffffffffff638);
  this = boost::operator<<(in_stack_fffffffffffff640,(char (*) [18])in_stack_fffffffffffff638);
  s = boost::operator<<(in_stack_fffffffffffff640,(char (*) [15])in_stack_fffffffffffff638);
  pbVar2 = (basic_wrap_stringstream<char> *)
           boost::basic_wrap_stringstream<char>::str_abi_cxx11_(pbVar2);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)this,(std_string *)s);
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_720,0xf8,local_730);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(pbVar2);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(was_supplied_test) {
  int int_opt;
  std::string str_opt;
  bool bool_opt;

  char command_line[] = "exe --int_opt 3 --str_opt test";
  int argc;
  // Only the returned char* needs to be deleted as the individual pointers simply point into command_line.
  std::unique_ptr<char*> argv(convert_to_command_args(command_line, argc));

  std::unique_ptr<options_i> options = std::unique_ptr<options_boost_po>(
    new options_boost_po(argc, argv.get()));

  option_group_definition arg_group("group1");
  arg_group.add(make_option("int_opt", int_opt));
  arg_group.add(make_option("str_opt", str_opt));
  arg_group.add(make_option("bool_opt", bool_opt));

  BOOST_CHECK_NO_THROW(options->add_and_parse(arg_group));
  BOOST_CHECK_EQUAL(int_opt, 3);
  BOOST_CHECK_EQUAL(str_opt, "test");
  BOOST_CHECK_EQUAL(bool_opt, false);

  BOOST_CHECK_EQUAL(options->was_supplied("int_opt"), true);
  BOOST_CHECK_EQUAL(options->was_supplied("str_opt"), true);
  BOOST_CHECK_EQUAL(options->was_supplied("bool_opt"), false);
  BOOST_CHECK_EQUAL(options->was_supplied("other_opt"), false);
}